

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QTzTransitionTime>::end(QList<QTzTransitionTime> *this)

{
  QTzTransitionTime *n;
  QArrayDataPointer<QTzTransitionTime> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QTzTransitionTime> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QTzTransitionTime> *)0x760949);
  QArrayDataPointer<QTzTransitionTime>::operator->(in_RDI);
  n = QArrayDataPointer<QTzTransitionTime>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }